

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

CeilLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_ceil(NeuralNetworkLayer *this)

{
  bool bVar1;
  CeilLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_ceil(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_ceil(this);
    this_00 = (CeilLayerParams *)operator_new(0x18);
    CeilLayerParams::CeilLayerParams(this_00);
    (this->layer_).ceil_ = this_00;
  }
  return (CeilLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::CeilLayerParams* NeuralNetworkLayer::mutable_ceil() {
  if (!has_ceil()) {
    clear_layer();
    set_has_ceil();
    layer_.ceil_ = new ::CoreML::Specification::CeilLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.ceil)
  return layer_.ceil_;
}